

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O2

void __thiscall antlr::CommonAST::~CommonAST(CommonAST *this)

{
  ~CommonAST(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

virtual ~CommonAST()
	{
	}